

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.cpp
# Opt level: O3

unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> __thiscall
Diligent::CopyPSOCreateInternalInfo(Diligent *this,void *pData)

{
  undefined4 *puVar1;
  pointer *__ptr;
  
  *(undefined8 *)this = 0;
  if (pData != (void *)0x0) {
    puVar1 = (undefined4 *)operator_new__(4);
    *(undefined4 **)this = puVar1;
    *puVar1 = *pData;
  }
  return (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Uint8[]> CopyPSOCreateInternalInfo(void* pData)
{
    std::unique_ptr<Uint8[]> pCopy;
    if (pData != nullptr)
    {
        static_assert(std::is_trivially_destructible<PSOCreateInternalInfo>::value, "PSOCreateInternalInfo must be trivially destructible");
        pCopy = std::make_unique<Uint8[]>(sizeof(PSOCreateInternalInfo));
        memcpy(pCopy.get(), pData, sizeof(PSOCreateInternalInfo));
    }

    return pCopy;
}